

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

bool __thiscall
rlottie::internal::renderer::Composition::update
          (Composition *this,int frameNo,VSize *size,bool keepAspectRatio)

{
  VSize VVar1;
  VSize VVar2;
  undefined4 in_EAX;
  uint uVar3;
  VMatrix *this_00;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  float sx;
  float fVar7;
  float fVar8;
  float sy;
  undefined1 local_38 [32];
  float local_18;
  undefined2 local_14;
  
  if (this->mHasDynamicValue == false) {
    iVar5 = -(uint)((*size).mw == (this->mViewSize).mw);
    iVar6 = -(uint)((*size).mh == (this->mViewSize).mh);
    auVar4._4_4_ = iVar5;
    auVar4._0_4_ = iVar5;
    auVar4._8_4_ = iVar6;
    auVar4._12_4_ = iVar6;
    uVar3 = movmskpd(in_EAX,auVar4);
    if (((((uVar3 & 1) != 0) && ((byte)((byte)uVar3 >> 1) != 0)) && (this->mCurFrameNo == frameNo))
       && (this->mKeepAspectRatio == keepAspectRatio)) {
      return false;
    }
  }
  VVar1 = *size;
  this->mViewSize = VVar1;
  this->mCurFrameNo = frameNo;
  this->mKeepAspectRatio = keepAspectRatio;
  local_38._0_12_ = ZEXT812(0x3f800000);
  local_38._12_4_ = 0;
  local_18 = 1.0;
  local_14._0_1_ = None;
  local_14._1_1_ = None;
  VVar2 = ((this->mModel).
           super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->mSize;
  fVar7 = (float)VVar2.mw;
  fVar8 = (float)VVar2.mh;
  sx = (float)VVar1.mw / fVar7;
  sy = (float)VVar1.mh / fVar8;
  local_38._16_16_ = local_38._0_16_;
  if (keepAspectRatio) {
    if (sx <= sy) {
      sy = sx;
    }
    this_00 = VMatrix::translate((VMatrix *)local_38,((float)VVar1.mw - fVar7 * sy) * 0.5,
                                 ((float)VVar1.mh - fVar8 * sy) * 0.5);
    sx = sy;
  }
  else {
    this_00 = (VMatrix *)local_38;
  }
  VMatrix::scale(this_00,sx,sy);
  (*this->mRootLayer->_vptr_Layer[2])(this->mRootLayer,frameNo,local_38);
  return true;
}

Assistant:

bool renderer::Composition::update(int frameNo, const VSize &size,
                                   bool keepAspectRatio)
{
    // check if cached frame is same as requested frame.
    if (!mHasDynamicValue && (mViewSize == size) && (mCurFrameNo == frameNo) &&
        (mKeepAspectRatio == keepAspectRatio))
        return false;

    mViewSize = size;
    mCurFrameNo = frameNo;
    mKeepAspectRatio = keepAspectRatio;

    /*
     * if viewbox dosen't scale exactly to the viewport
     * we scale the viewbox keeping AspectRatioPreserved and then align the
     * viewbox to the viewport using AlignCenter rule.
     */
    VMatrix m;
    VSize   viewPort = mViewSize;
    VSize   viewBox = mModel->size();
    float   sx = float(viewPort.width()) / viewBox.width();
    float   sy = float(viewPort.height()) / viewBox.height();
    if (mKeepAspectRatio) {
        float scale = std::min(sx, sy);
        float tx = (viewPort.width() - viewBox.width() * scale) * 0.5f;
        float ty = (viewPort.height() - viewBox.height() * scale) * 0.5f;
        m.translate(tx, ty).scale(scale, scale);
    } else {
        m.scale(sx, sy);
    }
    mRootLayer->update(frameNo, m, 1.0);
    return true;
}